

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O0

CharClass<wchar_t> * __thiscall
Centaurus::CharClass<wchar_t>::operator~
          (CharClass<wchar_t> *__return_storage_ptr__,CharClass<wchar_t> *this)

{
  bool bVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  pointer pRVar4;
  wchar_t local_6c;
  Range<wchar_t> *local_68;
  wchar_t local_5c;
  __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
  local_58;
  Range<wchar_t> *local_50;
  __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
  local_38;
  wchar_t local_2c;
  const_iterator cStack_28;
  wchar_t last_end;
  const_iterator i;
  CharClass<wchar_t> *this_local;
  CharClass<wchar_t> *cc;
  
  i._M_current._7_1_ = 0;
  CharClass(__return_storage_ptr__);
  cStack_28 = std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::
              cbegin(&this->m_ranges);
  local_2c = L'\x01';
  local_38._M_current =
       (Range<wchar_t> *)
       std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::cend
                 (&this->m_ranges);
  bVar1 = __gnu_cxx::operator!=(&stack0xffffffffffffffd8,&local_38);
  if (bVar1) {
    pRVar4 = __gnu_cxx::
             __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
             ::operator->(&stack0xffffffffffffffd8);
    wVar2 = Range<wchar_t>::start(pRVar4);
    if (wVar2 == L'\x01') {
      pRVar4 = __gnu_cxx::
               __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
               ::operator->(&stack0xffffffffffffffd8);
      local_2c = Range<wchar_t>::end(pRVar4);
      local_50 = (Range<wchar_t> *)
                 __gnu_cxx::
                 __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
                 ::operator++(&stack0xffffffffffffffd8,0);
    }
  }
  while( true ) {
    local_58._M_current =
         (Range<wchar_t> *)
         std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::cend
                   (&this->m_ranges);
    bVar1 = __gnu_cxx::operator!=(&stack0xffffffffffffffd8,&local_58);
    wVar2 = local_2c;
    if (!bVar1) break;
    pRVar4 = __gnu_cxx::
             __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
             ::operator->(&stack0xffffffffffffffd8);
    local_5c = Range<wchar_t>::start(pRVar4);
    std::vector<Centaurus::Range<wchar_t>,std::allocator<Centaurus::Range<wchar_t>>>::
    emplace_back<wchar_t&,wchar_t>
              ((vector<Centaurus::Range<wchar_t>,std::allocator<Centaurus::Range<wchar_t>>> *)
               &__return_storage_ptr__->m_ranges,&local_2c,&local_5c);
    pRVar4 = __gnu_cxx::
             __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
             ::operator->(&stack0xffffffffffffffd8);
    local_2c = Range<wchar_t>::end(pRVar4);
    local_68 = (Range<wchar_t> *)
               __gnu_cxx::
               __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
               ::operator++(&stack0xffffffffffffffd8,0);
  }
  wVar3 = std::numeric_limits<wchar_t>::max();
  if (wVar2 < wVar3) {
    local_6c = std::numeric_limits<wchar_t>::max();
    std::vector<Centaurus::Range<wchar_t>,std::allocator<Centaurus::Range<wchar_t>>>::
    emplace_back<wchar_t&,wchar_t>
              ((vector<Centaurus::Range<wchar_t>,std::allocator<Centaurus::Range<wchar_t>>> *)
               &__return_storage_ptr__->m_ranges,&local_2c,&local_6c);
  }
  return __return_storage_ptr__;
}

Assistant:

CharClass<TCHAR> operator~() const
    {
        CharClass<TCHAR> cc;

		typename std::vector<Range<TCHAR> >::const_iterator i = m_ranges.cbegin();
		TCHAR last_end = 1;

		if (i != m_ranges.cend())
		{
			if (i->start() == 1)
			{
				last_end = i->end();
				i++;
			}
		}

		for (; i != m_ranges.cend(); i++)
		{
			cc.m_ranges.emplace_back(last_end, i->start());
			last_end = i->end();
		}

		if (last_end < std::numeric_limits<TCHAR>::max())
			cc.m_ranges.emplace_back(last_end, std::numeric_limits<TCHAR>::max());

        return cc;
    }